

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode
GetMonitoredItems(void *handle,UA_NodeId objectId,size_t inputSize,UA_Variant *input,
                 size_t outputSize,UA_Variant *output)

{
  UA_Subscription *pUVar1;
  void *array;
  void *array_00;
  uint local_74;
  UA_UInt32 i;
  UA_UInt32 *serverHandles;
  UA_UInt32 *clientHandles;
  UA_MonitoredItem *monitoredItem;
  UA_UInt32 sizeOfOutput;
  UA_Subscription *subscription;
  UA_Session *session;
  UA_UInt32 subscriptionId;
  UA_Variant *output_local;
  size_t outputSize_local;
  UA_Variant *input_local;
  size_t inputSize_local;
  void *handle_local;
  
  pUVar1 = UA_Session_getSubscriptionByID(methodCallSession,*input->data);
  if (pUVar1 == (UA_Subscription *)0x0) {
    handle_local._4_4_ = 0x80280000;
  }
  else {
    monitoredItem._4_4_ = 0;
    for (clientHandles = (UA_UInt32 *)(pUVar1->monitoredItems).lh_first;
        clientHandles != (UA_UInt32 *)0x0; clientHandles = *(UA_UInt32 **)clientHandles) {
      monitoredItem._4_4_ = monitoredItem._4_4_ + 1;
    }
    if (monitoredItem._4_4_ == 0) {
      handle_local._4_4_ = 0;
    }
    else {
      array = UA_Array_new((ulong)monitoredItem._4_4_,UA_TYPES + 6);
      array_00 = UA_Array_new((ulong)monitoredItem._4_4_,UA_TYPES + 6);
      local_74 = 0;
      for (clientHandles = (UA_UInt32 *)(pUVar1->monitoredItems).lh_first;
          clientHandles != (UA_UInt32 *)0x0; clientHandles = *(UA_UInt32 **)clientHandles) {
        *(UA_UInt32 *)((long)array + (ulong)local_74 * 4) = clientHandles[0x11];
        *(UA_UInt32 *)((long)array_00 + (ulong)local_74 * 4) = clientHandles[6];
        local_74 = local_74 + 1;
      }
      UA_Variant_setArray(output,array,(ulong)monitoredItem._4_4_,UA_TYPES + 6);
      UA_Variant_setArray(output + 1,array_00,(ulong)monitoredItem._4_4_,UA_TYPES + 6);
      handle_local._4_4_ = 0;
    }
  }
  return handle_local._4_4_;
}

Assistant:

static UA_StatusCode
GetMonitoredItems(void *handle, const UA_NodeId objectId, size_t inputSize,
                  const UA_Variant *input, size_t outputSize, UA_Variant *output) {
    UA_UInt32 subscriptionId = *((UA_UInt32*)(input[0].data));
    UA_Session* session = methodCallSession;
    UA_Subscription* subscription = UA_Session_getSubscriptionByID(session, subscriptionId);
    if(!subscription)
        return UA_STATUSCODE_BADSUBSCRIPTIONIDINVALID;

    UA_UInt32 sizeOfOutput = 0;
    UA_MonitoredItem* monitoredItem;
    LIST_FOREACH(monitoredItem, &subscription->monitoredItems, listEntry) {
        ++sizeOfOutput;
    }
    if(sizeOfOutput==0)
        return UA_STATUSCODE_GOOD;

    UA_UInt32* clientHandles = UA_Array_new(sizeOfOutput, &UA_TYPES[UA_TYPES_UINT32]);
    UA_UInt32* serverHandles = UA_Array_new(sizeOfOutput, &UA_TYPES[UA_TYPES_UINT32]);
    UA_UInt32 i = 0;
    LIST_FOREACH(monitoredItem, &subscription->monitoredItems, listEntry) {
        clientHandles[i] = monitoredItem->clientHandle;
        serverHandles[i] = monitoredItem->itemId;
        ++i;
    }
    UA_Variant_setArray(&output[0], clientHandles, sizeOfOutput, &UA_TYPES[UA_TYPES_UINT32]);
    UA_Variant_setArray(&output[1], serverHandles, sizeOfOutput, &UA_TYPES[UA_TYPES_UINT32]);
    return UA_STATUSCODE_GOOD;
}